

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O3

void * __thiscall
cbtSortedOverlappingPairCache::removeOverlappingPair
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          ,cbtDispatcher *dispatcher)

{
  int *piVar1;
  undefined8 *puVar2;
  cbtBroadphasePair *pcVar3;
  void *pvVar4;
  cbtOverlappingPairCallback *pcVar5;
  cbtBroadphasePair *pcVar6;
  cbtBroadphaseProxy *pcVar7;
  cbtCollisionAlgorithm *pcVar8;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar9;
  cbtBroadphaseProxy *pcVar10;
  cbtCollisionAlgorithm *pcVar11;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar12;
  int iVar13;
  long lVar14;
  cbtBroadphaseProxy *pcVar15;
  long lVar16;
  int iVar17;
  
  iVar13 = (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
             _vptr_cbtOverlappingPairCallback[0xf])();
  if ((char)iVar13 == '\0') {
    iVar13 = (this->m_overlappingPairArray).m_size;
    pcVar15 = proxy0;
    pcVar7 = proxy1;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      pcVar15 = proxy1;
      pcVar7 = proxy0;
    }
    if (0 < (long)iVar13) {
      pcVar3 = (this->m_overlappingPairArray).m_data;
      iVar17 = 0;
      lVar16 = 0;
      do {
        if ((*(cbtBroadphaseProxy **)((long)&pcVar3->m_pProxy0 + lVar16) == pcVar7) &&
           (*(cbtBroadphaseProxy **)((long)&pcVar3->m_pProxy1 + lVar16) == pcVar15)) {
          if (iVar13 <= iVar17) {
            return (void *)0x0;
          }
          pvVar4 = *(void **)((long)&pcVar3->field_3 + lVar16);
          (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
            _vptr_cbtOverlappingPairCallback[8])(this,(long)&pcVar3->m_pProxy0 + lVar16,dispatcher);
          pcVar5 = this->m_ghostPairCallback;
          if (pcVar5 != (cbtOverlappingPairCallback *)0x0) {
            (*pcVar5->_vptr_cbtOverlappingPairCallback[3])(pcVar5,proxy0,proxy1,dispatcher);
          }
          lVar14 = (long)(this->m_overlappingPairArray).m_capacity;
          pcVar6 = (this->m_overlappingPairArray).m_data;
          puVar2 = (undefined8 *)((long)&pcVar6->m_pProxy0 + lVar16);
          pcVar7 = (cbtBroadphaseProxy *)*puVar2;
          pcVar15 = (cbtBroadphaseProxy *)puVar2[1];
          pcVar8 = (cbtCollisionAlgorithm *)puVar2[2];
          aVar9 = *(anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 *)(puVar2 + 3);
          pcVar3 = pcVar6 + lVar14 + -1;
          pcVar10 = pcVar3->m_pProxy1;
          pcVar11 = pcVar3->m_algorithm;
          aVar12 = pcVar3->field_3;
          puVar2 = (undefined8 *)((long)&pcVar6->m_pProxy0 + lVar16);
          *puVar2 = pcVar3->m_pProxy0;
          puVar2[1] = pcVar10;
          puVar2[2] = pcVar11;
          *(anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 *)(puVar2 + 3) = aVar12;
          pcVar3 = (this->m_overlappingPairArray).m_data + lVar14 + -1;
          pcVar3->m_pProxy0 = pcVar7;
          pcVar3->m_pProxy1 = pcVar15;
          pcVar3->m_algorithm = pcVar8;
          pcVar3->field_3 = aVar9;
          piVar1 = &(this->m_overlappingPairArray).m_size;
          *piVar1 = *piVar1 + -1;
          return pvVar4;
        }
        lVar16 = lVar16 + 0x20;
        iVar17 = iVar17 + 1;
      } while ((long)iVar13 << 5 != lVar16);
    }
  }
  return (void *)0x0;
}

Assistant:

void* cbtSortedOverlappingPairCache::removeOverlappingPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1, cbtDispatcher* dispatcher)
{
	if (!hasDeferredRemoval())
	{
		cbtBroadphasePair findPair(*proxy0, *proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			cbtBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair, dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1, dispatcher);

			m_overlappingPairArray.swap(findIndex, m_overlappingPairArray.capacity() - 1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}